

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_STRING::Load
          (_Type_STRING *this,istream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  char cVar1;
  string str;
  String local_38;
  
  Object::Reassign(object,(Type *)_type_string,0x20);
  String::String((String *)object->data);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
    cVar1 = std::istream::get();
    if (cVar1 == '\0') break;
    std::__cxx11::string::push_back((char)&str);
  }
  String::String(&local_38,&str);
  String::operator=((String *)object->data,&local_38);
  std::__cxx11::u32string::~u32string((u32string *)&local_38);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void LiteScript::_Type_STRING::Load(std::istream &stream, Object &object, unsigned int (Memory::*caller)(std::istream&)) const {
    object.Reassign(Type::STRING, sizeof(String));
    std::allocator<String> allocator;
    allocator.construct(&object.GetData<String>());
    std::string str;
    unsigned char c;
    while (!stream.eof() && (c = (unsigned char)stream.get()) != 0)
        str += c;
    object.GetData<String>() = String(str);
}